

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O2

void __thiscall
Js::JavascriptGenerator::SetFrameSlots
          (JavascriptGenerator *this,RegSlot slotCount,Type *frameSlotArray)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  ulong uVar5;
  
  RVar3 = FunctionBody::GetLocalsCount(*(FunctionBody **)((this->frame).ptr + 0x88));
  if (RVar3 != slotCount) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptGenerator.cpp"
                                ,0x86,
                                "(this->frame->GetFunctionBody()->GetLocalsCount() == slotCount)",
                                "Unexpected mismatch in frame slot count for generated.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  for (uVar5 = 0; slotCount != uVar5; uVar5 = uVar5 + 1) {
    *(void **)((this->frame).ptr + uVar5 * 8 + 0x160) = frameSlotArray[uVar5].ptr;
  }
  return;
}

Assistant:

void JavascriptGenerator::SetFrameSlots(Js::RegSlot slotCount, Field(Var)* frameSlotArray)
{
    AssertMsg(this->frame->GetFunctionBody()->GetLocalsCount() == slotCount, 
        "Unexpected mismatch in frame slot count for generated.");

    for (Js::RegSlot i = 0; i < slotCount; i++)
        GetFrame()->m_localSlots[i] = frameSlotArray[i];
}